

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_half_pass.cpp
# Opt level: O1

void __thiscall
spvtools::opt::ConvertToHalfPass::GenConvert
          (ConvertToHalfPass *this,uint32_t *val_idp,uint32_t width,Instruction *inst)

{
  IRContext *pIVar1;
  uint32_t uVar2;
  uint32_t type_id;
  Instruction *pIVar3;
  InstructionBuilder builder;
  InstructionBuilder local_50;
  
  pIVar1 = (this->super_Pass).context_;
  if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar1);
  }
  pIVar3 = analysis::DefUseManager::GetDef
                     ((pIVar1->def_use_mgr_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                      .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                      _M_head_impl,*val_idp);
  uVar2 = 0;
  if (pIVar3->has_type_id_ == true) {
    uVar2 = Instruction::GetSingleWordOperand(pIVar3,0);
  }
  type_id = EquivFloatTypeId(this,uVar2,width);
  if (type_id != uVar2) {
    pIVar1 = (this->super_Pass).context_;
    local_50.parent_ = IRContext::get_instr_block(pIVar1,inst);
    local_50.preserved_analyses_ = kAnalysisInstrToBlockMapping|kAnalysisBegin;
    local_50.context_ = pIVar1;
    local_50.insert_before_.super_iterator.node_ = (iterator)(iterator)inst;
    if (pIVar3->opcode_ == OpUndef) {
      pIVar3 = InstructionBuilder::AddNullaryOp(&local_50,type_id,OpUndef);
    }
    else {
      pIVar3 = InstructionBuilder::AddUnaryOp(&local_50,type_id,OpFConvert,*val_idp);
    }
    uVar2 = 0;
    if (pIVar3->has_result_id_ == true) {
      uVar2 = Instruction::GetSingleWordOperand(pIVar3,(uint)pIVar3->has_type_id_);
    }
    *val_idp = uVar2;
  }
  return;
}

Assistant:

void ConvertToHalfPass::GenConvert(uint32_t* val_idp, uint32_t width,
                                   Instruction* inst) {
  Instruction* val_inst = get_def_use_mgr()->GetDef(*val_idp);
  uint32_t ty_id = val_inst->type_id();
  uint32_t nty_id = EquivFloatTypeId(ty_id, width);
  if (nty_id == ty_id) return;
  Instruction* cvt_inst;
  InstructionBuilder builder(
      context(), inst,
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);
  if (val_inst->opcode() == spv::Op::OpUndef)
    cvt_inst = builder.AddNullaryOp(nty_id, spv::Op::OpUndef);
  else
    cvt_inst = builder.AddUnaryOp(nty_id, spv::Op::OpFConvert, *val_idp);
  *val_idp = cvt_inst->result_id();
}